

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_test.c
# Opt level: O0

void contended_state_contend_loop
               (contended_state *cs,void *mu,_func_void_void_ptr *lock,_func_void_void_ptr *unlock)

{
  int iVar1;
  int local_34;
  int local_30;
  int i;
  int j;
  int n;
  _func_void_void_ptr *unlock_local;
  _func_void_void_ptr *lock_local;
  void *mu_local;
  contended_state *cs_local;
  
  iVar1 = testing_n(cs->t);
  nsync::nsync_mu_rlock(&cs->start_done_mu);
  nsync::nsync_mu_wait
            (&cs->start_done_mu,contended_state_may_start,cs,(_func_int_void_ptr_void_ptr *)0x0);
  nsync::nsync_mu_runlock(&cs->start_done_mu);
  for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 10000) {
    for (local_34 = 0; local_34 != 10000; local_34 = local_34 + 1) {
      (*lock)(mu);
      cs->count = cs->count + 1;
      (*unlock)(mu);
    }
  }
  nsync::nsync_mu_lock(&cs->start_done_mu);
  cs->not_yet_done = cs->not_yet_done + -1;
  nsync::nsync_mu_unlock(&cs->start_done_mu);
  return;
}

Assistant:

static void contended_state_contend_loop (contended_state *cs,
					  void *mu, void (*lock) (void *),
					  void (*unlock) (void *)) {
	int n = testing_n (cs->t);
	int j;
	int i;
	nsync_mu_rlock (&cs->start_done_mu);
	nsync_mu_wait (&cs->start_done_mu, &contended_state_may_start, cs, NULL);
	nsync_mu_runlock (&cs->start_done_mu);

	for (j = 0; j < n; j += 10000) {
		for (i = 0; i != 10000; i++) {
			(*lock) (mu);
			cs->count++;
			(*unlock) (mu);
		}
	}

	nsync_mu_lock (&cs->start_done_mu);
	cs->not_yet_done--;
	nsync_mu_unlock (&cs->start_done_mu);
}